

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O2

int TIFFWriteDirectoryTagCheckedShort
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint16_t value)

{
  int iVar1;
  uint16_t m;
  
  if ((tif->tif_flags & 0x80) != 0) {
    TIFFSwabShort(&m);
  }
  iVar1 = TIFFWriteDirectoryTagData(tif,ndir,dir,tag,3,1,2,&m);
  return iVar1;
}

Assistant:

static int TIFFWriteDirectoryTagCheckedShort(TIFF *tif, uint32_t *ndir,
                                             TIFFDirEntry *dir, uint16_t tag,
                                             uint16_t value)
{
    uint16_t m;
    assert(sizeof(uint16_t) == 2);
    m = value;
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabShort(&m);
    return (
        TIFFWriteDirectoryTagData(tif, ndir, dir, tag, TIFF_SHORT, 1, 2, &m));
}